

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int subjournalPageIfRequired(PgHdr *pPg)

{
  uint uVar1;
  Pager *pPager_00;
  PagerSavepoint *pPVar2;
  sqlite3_file *psVar3;
  sqlite3_vfs *psVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  undefined8 in_RAX;
  MemJournal *p;
  Pager *pPager;
  int iVar8;
  long lVar9;
  undefined8 uStack_38;
  
  pPager_00 = pPg->pPager;
  iVar7 = pPager_00->nSavepoint;
  if (0 < (long)iVar7) {
    uVar1 = pPg->pgno;
    pPVar2 = pPager_00->aSavepoint;
    lVar9 = 0;
    uStack_38 = in_RAX;
    do {
      if ((uVar1 <= *(uint *)((long)pPVar2->aWalData + lVar9 + -8)) &&
         (iVar6 = sqlite3BitvecTestNotNull
                            (*(Bitvec **)((long)pPVar2->aWalData + lVar9 + -0x10),uVar1), iVar6 == 0
         )) {
        iVar7 = 0;
        if (pPager_00->journalMode != '\x02') {
          psVar3 = pPager_00->sjfd;
          iVar7 = 0;
          if (psVar3->pMethods == (sqlite3_io_methods *)0x0) {
            if ((pPager_00->journalMode == '\x04') ||
               (iVar6 = sqlite3Config.nStmtSpill, pPager_00->subjInMemory != '\0')) {
              iVar6 = -1;
            }
            psVar4 = pPager_00->pVfs;
            psVar3[8].pMethods = (sqlite3_io_methods *)0x0;
            psVar3[9].pMethods = (sqlite3_io_methods *)0x0;
            psVar3[6].pMethods = (sqlite3_io_methods *)0x0;
            psVar3[7].pMethods = (sqlite3_io_methods *)0x0;
            psVar3[4].pMethods = (sqlite3_io_methods *)0x0;
            psVar3[5].pMethods = (sqlite3_io_methods *)0x0;
            psVar3[2].pMethods = (sqlite3_io_methods *)0x0;
            psVar3[3].pMethods = (sqlite3_io_methods *)0x0;
            psVar3->pMethods = (sqlite3_io_methods *)0x0;
            psVar3[1].pMethods = (sqlite3_io_methods *)0x0;
            psVar3[10].pMethods = (sqlite3_io_methods *)0x0;
            if (iVar6 == 0) {
              iVar7 = (*psVar4->xOpen)((sqlite3_file *)psVar4,0);
            }
            else {
              iVar8 = 0x3f8;
              if (0 < iVar6) {
                iVar8 = iVar6;
              }
              *(int *)&psVar3[1].pMethods = iVar8;
              psVar3->pMethods = &MemJournalMethods;
              *(int *)((long)&psVar3[1].pMethods + 4) = iVar6;
              *(undefined4 *)&psVar3[8].pMethods = 0x201e;
              psVar3[10].pMethods = (sqlite3_io_methods *)0x0;
              psVar3[9].pMethods = (sqlite3_io_methods *)psVar4;
            }
          }
          if (iVar7 == 0) {
            pvVar5 = pPg->pData;
            lVar9 = ((long)pPager_00->pageSize + 4) * (ulong)pPager_00->nSubRec;
            uVar1 = pPg->pgno;
            uStack_38 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                                 uVar1 << 0x18,(undefined4)uStack_38);
            iVar7 = (*pPager_00->sjfd->pMethods->xWrite)
                              (pPager_00->sjfd,(void *)((long)&uStack_38 + 4),4,lVar9);
            if (iVar7 == 0) {
              iVar7 = (*pPager_00->sjfd->pMethods->xWrite)
                                (pPager_00->sjfd,pvVar5,pPager_00->pageSize,lVar9 + 4);
            }
          }
        }
        if (iVar7 != 0) {
          return iVar7;
        }
        pPager_00->nSubRec = pPager_00->nSubRec + 1;
        iVar7 = addToSavepointBitvecs(pPager_00,pPg->pgno);
        return iVar7;
      }
      lVar9 = lVar9 + 0x30;
    } while ((long)iVar7 * 0x30 != lVar9);
  }
  return 0;
}

Assistant:

static int subjRequiresPage(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  PagerSavepoint *p;
  Pgno pgno = pPg->pgno;
  int i;
  for(i=0; i<pPager->nSavepoint; i++){
    p = &pPager->aSavepoint[i];
    if( p->nOrig>=pgno && 0==sqlite3BitvecTestNotNull(p->pInSavepoint, pgno) ){
      return 1;
    }
  }
  return 0;
}